

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.h
# Opt level: O0

void __thiscall lunasvg::SVGLayoutState::SVGLayoutState(SVGLayoutState *this)

{
  SVGLayoutState *this_local;
  
  this->m_parent = (SVGLayoutState *)0x0;
  this->m_element = (SVGElement *)0x0;
  Paint::Paint(&this->m_fill,(Color *)&Color::Black);
  Paint::Paint(&this->m_stroke,(Color *)&Color::Transparent);
  (this->m_color).m_value = 0xff000000;
  (this->m_stop_color).m_value = 0xff000000;
  this->m_opacity = 1.0;
  this->m_fill_opacity = 1.0;
  this->m_stroke_opacity = 1.0;
  this->m_stop_opacity = 1.0;
  this->m_stroke_miterlimit = 4.0;
  this->m_font_size = 12.0;
  BaselineShift::BaselineShift(&this->m_baseline_shit);
  Length::Length(&this->m_stroke_width,1.0,None);
  Length::Length(&this->m_stroke_dashoffset,0.0,None);
  std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector(&this->m_stroke_dasharray);
  this->m_stroke_linecap = Butt;
  this->m_stroke_linejoin = Miter;
  this->m_fill_rule = NonZero;
  this->m_clip_rule = NonZero;
  this->m_font_weight = Normal;
  this->m_font_style = Normal;
  this->m_alignment_baseline = Auto;
  this->m_dominant_baseline = Auto;
  this->m_text_anchor = Start;
  this->m_white_space = Default;
  this->m_direction = Ltr;
  this->m_display = Inline;
  this->m_visibility = Visible;
  this->m_overflow = Visible;
  this->m_mask_type = Luminance;
  std::__cxx11::string::string((string *)&this->m_mask);
  std::__cxx11::string::string((string *)&this->m_clip_path);
  std::__cxx11::string::string((string *)&this->m_marker_start);
  std::__cxx11::string::string((string *)&this->m_marker_mid);
  std::__cxx11::string::string((string *)&this->m_marker_end);
  std::__cxx11::string::string((string *)&this->m_font_family);
  return;
}

Assistant:

SVGLayoutState() = default;